

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::text_format_unittest::AbslStringifyTest_StringifyMetaAnnotatedIsRedacted_Test::
TestBody(AbslStringifyTest_StringifyMetaAnnotatedIsRedacted_Test *this)

{
  string_view value;
  string_view value_00;
  bool bVar1;
  uint32_t *puVar2;
  Arena *arena;
  char *message;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *matcher;
  AlphaNum *a;
  Arg *in_R9;
  string_view format;
  AssertHelper local_218;
  Message local_210;
  string local_208;
  AlphaNum local_1e8;
  string local_1b8;
  undefined8 local_198;
  undefined8 uStack_190;
  Arg local_188;
  undefined8 local_158;
  undefined8 uStack_150;
  Arg local_140;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  string local_100;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_e0;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>_>
  local_c8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  undefined1 local_90 [8];
  TestRedactedMessage proto;
  AbslStringifyTest_StringifyMetaAnnotatedIsRedacted_Test *this_local;
  StringLike<std::__cxx11::basic_string<char>_> *regex;
  
  proto.field_0._impl_.any_field_ = (Any *)this;
  proto2_unittest::TestRedactedMessage::TestRedactedMessage((TestRedactedMessage *)local_90);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&proto.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 2;
  arena = protobuf::MessageLite::GetArena((MessageLite *)local_90);
  internal::ArenaStringPtr::Set(&proto.field_0._impl_.text_field_,"foo",arena);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_110,"$0\nmeta_annotated: $1\n");
  local_158 = 0xe;
  uStack_150 = 0x1df8463;
  value_00._M_str = (char *)0x1df8463;
  value_00._M_len = 0xe;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_140,value_00);
  local_198 = 0xc;
  uStack_190 = 0x1dee07d;
  value._M_str = (char *)0x1dee07d;
  value._M_len = 0xc;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_188,value);
  format._M_str = (char *)&local_140;
  format._M_len = (size_t)local_110._M_str;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_100,(lts_20250127 *)local_110._M_len,format,&local_188,in_R9);
  testing::MatchesRegex<std::__cxx11::string>(&local_e0,(testing *)&local_100,regex);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>>
            (&local_c8,(internal *)&local_e0,matcher);
  local_208.field_2._M_allocated_capacity = 0;
  local_208.field_2._8_8_ = 0;
  local_208._M_dataplus = (_Alloc_hider)0x0;
  local_208._1_7_ = 0;
  local_208._M_string_length = 0;
  absl::lts_20250127::strings_internal::StringifySink::StringifySink((StringifySink *)&local_208);
  absl::lts_20250127::AlphaNum::AlphaNum<proto2_unittest::TestRedactedMessage,void>
            (&local_1e8,(TestRedactedMessage *)local_90,(StringifySink *)&local_208);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_1b8,(lts_20250127 *)&local_1e8,a);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>>
  ::operator()(local_b0,(char *)&local_c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "absl::StrCat(proto)");
  std::__cxx11::string::~string((string *)&local_1b8);
  absl::lts_20250127::strings_internal::StringifySink::~StringifySink((StringifySink *)&local_208);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>_>
  ::~PredicateFormatterFromMatcher(&local_c8);
  testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>::~PolymorphicMatcher
            (&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0xaaa,message);
    testing::internal::AssertHelper::operator=(&local_218,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  proto2_unittest::TestRedactedMessage::~TestRedactedMessage((TestRedactedMessage *)local_90);
  return;
}

Assistant:

TEST(AbslStringifyTest, StringifyMetaAnnotatedIsRedacted) {
  unittest::TestRedactedMessage proto;
  proto.set_meta_annotated("foo");
  EXPECT_THAT(absl::StrCat(proto), testing::MatchesRegex(absl::Substitute(
                                       "$0\n"
                                       "meta_annotated: $1\n",
                                       kTextMarkerRegex, value_replacement)));
}